

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

int stream_update_timing_info(cubeb_stream_conflict *stm)

{
  pa_operation *ppVar1;
  void *in_RDI;
  pa_operation *o;
  int r;
  pa_operation *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  local_4 = -1;
  if (*(long *)((long)in_RDI + 0x10) != 0) {
    ppVar1 = (*cubeb_pa_stream_update_timing_info)
                       (*(pa_stream **)((long)in_RDI + 0x10),stream_success_callback,in_RDI);
    if (ppVar1 != (pa_operation *)0x0) {
      local_4 = operation_wait((cubeb_conflict *)CONCAT44(local_4,in_stack_ffffffffffffffe8),
                               (pa_stream *)ppVar1,in_stack_ffffffffffffffd8);
      (*cubeb_pa_operation_unref)(ppVar1);
    }
    if (local_4 != 0) {
      return local_4;
    }
  }
  if ((*(long *)((long)in_RDI + 0x18) != 0) &&
     (ppVar1 = (*cubeb_pa_stream_update_timing_info)
                         (*(pa_stream **)((long)in_RDI + 0x18),stream_success_callback,in_RDI),
     ppVar1 != (pa_operation *)0x0)) {
    local_4 = operation_wait((cubeb_conflict *)CONCAT44(local_4,in_stack_ffffffffffffffe8),
                             (pa_stream *)ppVar1,in_stack_ffffffffffffffd8);
    (*cubeb_pa_operation_unref)(ppVar1);
  }
  return local_4;
}

Assistant:

static int
stream_update_timing_info(cubeb_stream * stm)
{
  int r = -1;
  pa_operation * o = NULL;
  if (stm->output_stream) {
    o = WRAP(pa_stream_update_timing_info)(stm->output_stream,
                                           stream_success_callback, stm);
    if (o) {
      r = operation_wait(stm->context, stm->output_stream, o);
      WRAP(pa_operation_unref)(o);
    }
    if (r != 0) {
      return r;
    }
  }

  if (stm->input_stream) {
    o = WRAP(pa_stream_update_timing_info)(stm->input_stream,
                                           stream_success_callback, stm);
    if (o) {
      r = operation_wait(stm->context, stm->input_stream, o);
      WRAP(pa_operation_unref)(o);
    }
  }

  return r;
}